

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O2

string * __thiscall
Jupiter::Socket::resolveHostname_abi_cxx11_
          (string *__return_storage_ptr__,Socket *this,char *hostname,uint result)

{
  addrinfo *this_00;
  
  this_00 = getAddrInfo((char *)this,(char *)0x0);
  if (this_00 == (addrinfo *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    resolveHostname_abi_cxx11_
              (__return_storage_ptr__,(Socket *)this_00,(addrinfo *)((ulong)hostname & 0xffffffff),
               result);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Jupiter::Socket::resolveHostname(const char *hostname, unsigned int result) { // static
	addrinfo *info = Jupiter::Socket::getAddrInfo(hostname, 0);
	if (info == nullptr) {
		return {};
	}

	return Jupiter::Socket::resolveHostname(info, result);
}